

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkCleanupNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fVerbose)

{
  uint uVar1;
  Abc_Obj_t **ppNodes;
  uint uVar2;
  uint *__ptr;
  void *pvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  uint uVar7;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x1fc,"int Abc_NtkCleanupNodes(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar3 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar3;
  pVVar5 = pNtk->vCos;
  if (0 < pVVar5->nSize) {
    uVar2 = *__ptr;
    uVar1 = __ptr[1];
    pvVar3 = *(void **)(__ptr + 2);
    lVar6 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar6];
      if (uVar1 + (int)lVar6 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pvVar3 == (void *)0x0) {
            pvVar3 = malloc(0x80);
          }
          else {
            pvVar3 = realloc(pvVar3,0x80);
          }
          uVar2 = 0x10;
        }
        else {
          uVar7 = uVar2 * 2;
          if (SBORROW4(uVar2,uVar7) != 0 < (int)uVar2) {
            uVar2 = uVar7;
            if (pvVar3 == (void *)0x0) {
              pvVar3 = malloc((ulong)uVar7 << 3);
            }
            else {
              pvVar3 = realloc(pvVar3,(ulong)uVar7 << 3);
            }
          }
        }
      }
      *(void **)((long)pvVar3 + lVar6 * 8 + (long)(int)uVar1 * 8) = pvVar4;
      lVar6 = lVar6 + 1;
      pVVar5 = pNtk->vCos;
    } while (lVar6 < pVVar5->nSize);
    __ptr[1] = uVar1 + (int)lVar6;
    *__ptr = uVar2;
    *(void **)(__ptr + 2) = pvVar3;
  }
  if (0 < vRoots->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = vRoots->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        uVar2 = __ptr[1];
        uVar1 = *__ptr;
        if (uVar2 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar7 = 0x10;
          }
          else {
            uVar7 = uVar1 * 2;
            if ((int)uVar7 <= (int)uVar1) goto LAB_0031665f;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = uVar7;
        }
LAB_0031665f:
        __ptr[1] = uVar2 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pvVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vRoots->nSize);
  }
  ppNodes = *(Abc_Obj_t ***)(__ptr + 2);
  pVVar5 = Abc_NtkDfsNodes(pNtk,ppNodes,__ptr[1]);
  if (ppNodes != (Abc_Obj_t **)0x0) {
    free(ppNodes);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  uVar2 = Abc_NtkReduceNodes(pNtk,pVVar5);
  if (fVerbose != 0) {
    printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar2);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  return uVar2;
}

Assistant:

int Abc_NtkCleanupNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vStarts;
    Abc_Obj_t * pObj;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // collect starting nodes into one array
    vStarts = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vStarts, pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( pObj )
            Vec_PtrPush( vStarts, pObj );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vStarts), Vec_PtrSize(vStarts) );
    Vec_PtrFree( vStarts );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}